

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O2

string * flatbuffers::jsons::anon_unknown_1::GenTypeRef<flatbuffers::StructDef>
                   (string *__return_storage_ptr__,StructDef *enum_def)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  GenFullName<flatbuffers::StructDef>(&local_30,enum_def);
  std::operator+(&local_50,"\"$ref\" : \"#/definitions/",&local_30);
  std::operator+(__return_storage_ptr__,&local_50,"\"");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenTypeRef(const T *enum_def) {
  return "\"$ref\" : \"#/definitions/" + GenFullName(enum_def) + "\"";
}